

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

symbol * Symbol_find(char *key)

{
  uint uVar1;
  int iVar2;
  symbol *local_30;
  s_x2node *local_28;
  x2node *np;
  uint h;
  char *key_local;
  
  if (x2a == (s_x2 *)0x0) {
    key_local = (char *)0x0;
  }
  else {
    uVar1 = strhash(key);
    local_28 = x2a->ht[uVar1 & x2a->size - 1U];
    while ((local_28 != (s_x2node *)0x0 && (iVar2 = strcmp(local_28->key,key), iVar2 != 0))) {
      local_28 = local_28->next;
    }
    if (local_28 == (s_x2node *)0x0) {
      local_30 = (symbol *)0x0;
    }
    else {
      local_30 = local_28->data;
    }
    key_local = (char *)local_30;
  }
  return (symbol *)key_local;
}

Assistant:

struct symbol *Symbol_find(const char *key)
{
  unsigned h;
  x2node *np;

  if( x2a==0 ) return 0;
  h = strhash(key) & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}